

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.h
# Opt level: O2

errc psql::serialization_traits<psql::row_description,_(psql::serialization_tag)0>::deserialize_
               (row_description *output,deserialization_context *ctx)

{
  errc eVar1;
  long lVar2;
  long lVar3;
  int16_t num_fields;
  
  num_fields = 0;
  eVar1 = serialization_traits<short,_(psql::serialization_tag)1>::deserialize_(&num_fields,ctx);
  if (eVar1 == ok) {
    std::vector<psql::single_row_description,_std::allocator<psql::single_row_description>_>::resize
              (&output->rows,(long)num_fields);
    lVar3 = -1;
    lVar2 = 0;
    do {
      lVar3 = lVar3 + 1;
      if (num_fields <= lVar3) {
        return ok;
      }
      eVar1 = deserialize_struct<0ul,psql::single_row_description>
                        ((single_row_description *)
                         ((long)&(((output->rows).
                                   super__Vector_base<psql::single_row_description,_std::allocator<psql::single_row_description>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->name).
                                 super_value_holder<std::basic_string_view<char,_std::char_traits<char>_>_>
                         + lVar2),ctx);
      lVar2 = lVar2 + 0x28;
    } while (eVar1 == ok);
  }
  return eVar1;
}

Assistant:

static inline errc deserialize_(row_description& output, deserialization_context& ctx)
	{
		std::int16_t num_fields = 0;
		auto err = deserialize(num_fields, ctx);
		if (err != errc::ok) return err;

		output.rows.resize(num_fields); // noexcept specifiers are not correct but ok for a prototype
		for (int i = 0; i < num_fields; ++i)
		{
			err = deserialize(output.rows[i], ctx);
			if (err != errc::ok) return err;
		}

		return errc::ok;
	}